

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O0

void anon_unknown.dwarf_54e4::GetOpenFileDescriptors
               (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *open_fds)

{
  int iVar1;
  int *y;
  Tester *this;
  int local_1bc;
  Tester local_1b8;
  value_type local_18;
  int local_14;
  int fd;
  int max_fd;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *open_fds_local;
  
  local_14 = 0;
  _fd = open_fds;
  GetMaxFileDescriptor(&local_14);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    iVar1 = dup2(local_18,local_18);
    if (iVar1 == local_18) {
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                (_fd,&local_18);
    }
    else {
      leveldb::test::Tester::Tester
                (&local_1b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/env_posix_test.cc"
                 ,0x62);
      local_1bc = 9;
      y = __errno_location();
      this = leveldb::test::Tester::IsEq<int,int>(&local_1b8,&local_1bc,y);
      leveldb::test::Tester::operator<<
                (this,(char (*) [60])"dup2() should set errno to EBADF on closed file descriptors");
      leveldb::test::Tester::~Tester(&local_1b8);
    }
  }
  return;
}

Assistant:

void GetOpenFileDescriptors(std::unordered_set<int>* open_fds) {
  int max_fd = 0;
  GetMaxFileDescriptor(&max_fd);

  for (int fd = 0; fd < max_fd; ++fd) {
    if (::dup2(fd, fd) != fd) {
      // When given the same file descriptor twice, dup2() returns -1 if the
      // file descriptor is closed, or the given file descriptor if it is open.
      //
      // Double-check that dup2() is saying the fd is closed.
      ASSERT_EQ(EBADF, errno)
          << "dup2() should set errno to EBADF on closed file descriptors";
      continue;
    }
    open_fds->insert(fd);
  }
}